

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::SourcePackage::Dump(SourcePackage *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_98 [136];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  GenericPackage::Dump(&this->super_GenericPackage,stream);
  pcVar1 = Kumu::UUID::EncodeString(&this->Descriptor,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","Descriptor",pcVar1);
  return;
}

Assistant:

void
SourcePackage::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  GenericPackage::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "Descriptor", Descriptor.EncodeString(identbuf, IdentBufferLen));
}